

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ieee.h
# Opt level: O2

DiyFp __thiscall FIX::double_conversion::Double::AsDiyFp(Double *this)

{
  ulong uVar1;
  uint __line;
  ulong uVar2;
  ulong uVar3;
  uint64_t d64;
  ulong uVar4;
  char *__assertion;
  DiyFp DVar5;
  
  uVar1 = this->d64_;
  if ((long)uVar1 < 0) {
    __assertion = "Sign() > 0";
    __line = 0x3c;
  }
  else {
    uVar2 = uVar1 & 0x7ff0000000000000;
    if (uVar2 != 0x7ff0000000000000) {
      uVar3 = (uVar1 & 0xfffffffffffff) + 0x10000000000000;
      if (uVar2 == 0) {
        uVar3 = uVar1 & 0xfffffffffffff;
      }
      uVar4 = 0xfffffbce;
      if (uVar2 != 0) {
        uVar4 = (ulong)((uint)(uVar1 >> 0x34) - 0x433);
      }
      DVar5._8_8_ = uVar4;
      DVar5.f_ = uVar3;
      return DVar5;
    }
    __assertion = "!IsSpecial()";
    __line = 0x3d;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/ieee.h"
                ,__line,"DiyFp FIX::double_conversion::Double::AsDiyFp() const");
}

Assistant:

DiyFp AsDiyFp() const {
    ASSERT(Sign() > 0);
    ASSERT(!IsSpecial());
    return DiyFp(Significand(), Exponent());
  }